

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinholecamera.hpp
# Opt level: O0

Ray * __thiscall PinholeCamera::sampleray(PinholeCamera *this,vec2f pos,Sampler *param_3)

{
  point p;
  vec3f *in_RSI;
  Ray *in_RDI;
  vec3f d;
  vec3f *v;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 uVar1;
  
  p = *(point *)&in_RSI[1].y;
  v = in_RSI + 5;
  uVar1 = 0x3f800000;
  ::operator*(SUB84(in_RSI,0),v);
  ::operator+((vec3f *)CONCAT44(uVar1,in_stack_fffffffffffffef0),in_RSI);
  ::operator*(SUB84(in_RSI,0),v);
  ::operator+((vec3f *)CONCAT44(uVar1,in_stack_fffffffffffffef0),in_RSI);
  d = normalized((vec3f *)CONCAT44(uVar1,in_stack_fffffffffffffef0));
  Ray::Ray(in_RDI,p,d);
  return in_RDI;
}

Assistant:

Ray sampleray(vec2f pos, Sampler&) const {
		return Ray(position, normalized(dir + (1-pos.x*2) * lefthalf + (1-pos.y*2) * uphalf));
	}